

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int uv_fs_symlink(uv_loop_t *loop,uv_fs_t *req,char *path,char *new_path,int flags,uv_fs_cb cb)

{
  long *plVar1;
  void *pvVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  char *__dest;
  
  req->type = UV_FS;
  if (cb != (uv_fs_cb)0x0) {
    req->active_queue[0] = loop->active_reqs;
    plVar1 = (long *)loop->active_reqs[1];
    req->active_queue[1] = plVar1;
    *plVar1 = (long)req->active_queue;
    loop->active_reqs[1] = req->active_queue;
  }
  req->path = (char *)0x0;
  req->new_path = (char *)0x0;
  req->fs_type = UV_FS_SYMLINK;
  req->result = 0;
  req->ptr = (void *)0x0;
  req->loop = loop;
  req->cb = cb;
  if (cb == (uv_fs_cb)0x0) {
    req->path = path;
    req->new_path = new_path;
    req->flags = flags;
    uv__fs_work(&req->work_req);
    iVar3 = (int)req->result;
  }
  else {
    sVar4 = strlen(path);
    sVar5 = strlen(new_path);
    __dest = (char *)uv__malloc(sVar5 + sVar4 + 2);
    req->path = __dest;
    if (__dest == (char *)0x0) {
      if (loop->active_reqs == (void **)loop->active_reqs[0]) {
        __assert_fail("uv__has_active_reqs(loop)",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/fs.c"
                      ,0x517,
                      "int uv_fs_symlink(uv_loop_t *, uv_fs_t *, const char *, const char *, int, uv_fs_cb)"
                     );
      }
      pvVar2 = req->active_queue[0];
      *(void **)req->active_queue[1] = pvVar2;
      *(void **)((long)pvVar2 + 8) = req->active_queue[1];
      iVar3 = -0xc;
    }
    else {
      req->new_path = __dest + sVar4 + 1;
      memcpy(__dest,path,sVar4 + 1);
      memcpy(req->new_path,new_path,sVar5 + 1);
      req->flags = flags;
      uv__work_submit(loop,&req->work_req,uv__fs_work,uv__fs_done);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int uv_fs_symlink(uv_loop_t* loop,
                  uv_fs_t* req,
                  const char* path,
                  const char* new_path,
                  int flags,
                  uv_fs_cb cb) {
  INIT(SYMLINK);
  PATH2;
  req->flags = flags;
  POST;
}